

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O1

Vec2d ** __thiscall Quad::getExtremities(Quad *this)

{
  Vec2d *this_00;
  Vec2d *pVVar1;
  Vec2d **ppVVar2;
  bool bVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  
  ppVVar2 = (Vec2d **)operator_new__(0x10);
  if (0 < this->vertexCount) {
    lVar4 = 0;
    bVar3 = false;
    do {
      this_00 = this->vertices[lVar4];
      if (bVar3) {
        fVar5 = Vec2d::getX(this_00);
        pVVar1 = *ppVVar2;
        fVar6 = Vec2d::getX(pVVar1);
        if (fVar5 <= fVar6) {
          fVar5 = Vec2d::getY(this_00);
          fVar6 = Vec2d::getY(pVVar1);
          if (fVar5 <= fVar6) {
            *ppVVar2 = this_00;
          }
        }
        fVar5 = Vec2d::getX(this_00);
        pVVar1 = ppVVar2[1];
        fVar6 = Vec2d::getX(pVVar1);
        if (fVar6 <= fVar5) {
          fVar5 = Vec2d::getY(this_00);
          fVar6 = Vec2d::getY(pVVar1);
          if (fVar6 <= fVar5) goto LAB_00117755;
        }
      }
      else {
        *ppVVar2 = this_00;
        bVar3 = true;
LAB_00117755:
        ppVVar2[1] = this_00;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->vertexCount);
  }
  return ppVVar2;
}

Assistant:

Vec2d** Quad::getExtremities() {
    Vec2d** extremities = new Vec2d*[2];
    bool initialised = false;
    for (int i = 0; i < vertexCount; i++) {
        Vec2d* vec = vertices[i];
        if (!initialised) {
            extremities[0] = vec;
            extremities[1] = vec;
            initialised = true;
        } else {
            if (vec->getX() <= extremities[0]->getX() && vec->getY() <= extremities[0]->getY()) {
                extremities[0] = vec;
            }
            if (vec->getX() >= extremities[1]->getX() && vec->getY() >= extremities[1]->getY()) {
                extremities[1] = vec;
            }
        }
        vec = nullptr;
    }
    return extremities;
}